

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_ryg_dxt.cpp
# Opt level: O1

void ryg_dxt::sInitDXT(void)

{
  char cVar1;
  char cVar9;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  undefined1 auVar31 [16];
  long lVar32;
  sInt i;
  int iVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  uint uVar53;
  uint uVar54;
  uint uVar55;
  uint uVar56;
  uint uVar57;
  uint uVar58;
  uint uVar59;
  uint uVar60;
  uint uVar61;
  uint uVar62;
  uint uVar63;
  uint uVar64;
  uint uVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  short sVar68;
  undefined1 auVar73 [12];
  undefined1 auVar76 [16];
  undefined1 auVar78 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  short sVar82;
  undefined1 auVar87 [12];
  undefined1 auVar90 [16];
  undefined1 auVar92 [16];
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  undefined4 uVar69;
  undefined6 uVar70;
  undefined8 uVar71;
  undefined1 auVar72 [12];
  undefined1 auVar74 [14];
  undefined1 auVar75 [14];
  undefined1 auVar77 [16];
  undefined1 auVar79 [16];
  undefined4 uVar83;
  undefined6 uVar84;
  undefined8 uVar85;
  undefined1 auVar86 [12];
  undefined1 auVar88 [14];
  undefined1 auVar89 [14];
  undefined1 auVar91 [16];
  undefined1 auVar93 [16];
  
  auVar31 = _DAT_001b4750;
  uVar34 = 0xc;
  uVar35 = 0xd;
  uVar36 = 0xe;
  uVar37 = 0xf;
  uVar38 = 8;
  uVar39 = 9;
  uVar40 = 10;
  uVar41 = 0xb;
  uVar42 = 4;
  uVar43 = 5;
  uVar44 = 6;
  uVar45 = 7;
  uVar46 = 0;
  uVar47 = 1;
  uVar48 = 2;
  uVar49 = 3;
  lVar32 = 0;
  uVar62 = uVar34;
  uVar63 = uVar35;
  uVar64 = uVar36;
  uVar65 = uVar37;
  uVar58 = uVar38;
  uVar59 = uVar39;
  uVar60 = uVar40;
  uVar61 = uVar41;
  uVar54 = uVar42;
  uVar55 = uVar43;
  uVar56 = uVar44;
  uVar57 = uVar45;
  uVar50 = uVar46;
  uVar51 = uVar47;
  uVar52 = uVar48;
  uVar53 = uVar49;
  do {
    auVar90._0_4_ = uVar50 * 8 + (uVar46 >> 2);
    auVar90._4_4_ = uVar51 * 8 + (uVar47 >> 2);
    auVar90._8_4_ = uVar52 * 8 + (uVar48 >> 2);
    auVar90._12_4_ = uVar53 * 8 + (uVar49 >> 2);
    auVar66._0_4_ = uVar54 * 8 + (uVar42 >> 2);
    auVar66._4_4_ = uVar55 * 8 + (uVar43 >> 2);
    auVar66._8_4_ = uVar56 * 8 + (uVar44 >> 2);
    auVar66._12_4_ = uVar57 * 8 + (uVar45 >> 2);
    auVar76._0_4_ = uVar58 * 8 + (uVar38 >> 2);
    auVar76._4_4_ = uVar59 * 8 + (uVar39 >> 2);
    auVar76._8_4_ = uVar60 * 8 + (uVar40 >> 2);
    auVar76._12_4_ = uVar61 * 8 + (uVar41 >> 2);
    auVar80._0_4_ = uVar62 * 8 + (uVar34 >> 2);
    auVar80._4_4_ = uVar63 * 8 + (uVar35 >> 2);
    auVar80._8_4_ = uVar64 * 8 + (uVar36 >> 2);
    auVar80._12_4_ = uVar65 * 8 + (uVar37 >> 2);
    auVar90 = auVar90 & auVar31;
    auVar66 = auVar66 & auVar31;
    sVar17 = auVar90._0_2_;
    cVar1 = (0 < sVar17) * (sVar17 < 0x100) * auVar90[0] - (0xff < sVar17);
    sVar17 = auVar90._2_2_;
    sVar82 = CONCAT11((0 < sVar17) * (sVar17 < 0x100) * auVar90[2] - (0xff < sVar17),cVar1);
    sVar17 = auVar90._4_2_;
    cVar2 = (0 < sVar17) * (sVar17 < 0x100) * auVar90[4] - (0xff < sVar17);
    sVar17 = auVar90._6_2_;
    uVar83 = CONCAT13((0 < sVar17) * (sVar17 < 0x100) * auVar90[6] - (0xff < sVar17),
                      CONCAT12(cVar2,sVar82));
    sVar17 = auVar90._8_2_;
    cVar3 = (0 < sVar17) * (sVar17 < 0x100) * auVar90[8] - (0xff < sVar17);
    sVar17 = auVar90._10_2_;
    uVar84 = CONCAT15((0 < sVar17) * (sVar17 < 0x100) * auVar90[10] - (0xff < sVar17),
                      CONCAT14(cVar3,uVar83));
    sVar17 = auVar90._12_2_;
    cVar4 = (0 < sVar17) * (sVar17 < 0x100) * auVar90[0xc] - (0xff < sVar17);
    sVar17 = auVar90._14_2_;
    uVar85 = CONCAT17((0 < sVar17) * (sVar17 < 0x100) * auVar90[0xe] - (0xff < sVar17),
                      CONCAT16(cVar4,uVar84));
    sVar17 = auVar66._0_2_;
    cVar5 = (0 < sVar17) * (sVar17 < 0x100) * auVar66[0] - (0xff < sVar17);
    sVar17 = auVar66._2_2_;
    auVar86._0_10_ =
         CONCAT19((0 < sVar17) * (sVar17 < 0x100) * auVar66[2] - (0xff < sVar17),
                  CONCAT18(cVar5,uVar85));
    sVar17 = auVar66._4_2_;
    cVar6 = (0 < sVar17) * (sVar17 < 0x100) * auVar66[4] - (0xff < sVar17);
    auVar86[10] = cVar6;
    sVar17 = auVar66._6_2_;
    auVar86[0xb] = (0 < sVar17) * (sVar17 < 0x100) * auVar66[6] - (0xff < sVar17);
    sVar17 = auVar66._8_2_;
    cVar7 = (0 < sVar17) * (sVar17 < 0x100) * auVar66[8] - (0xff < sVar17);
    auVar88[0xc] = cVar7;
    auVar88._0_12_ = auVar86;
    sVar17 = auVar66._10_2_;
    auVar88[0xd] = (0 < sVar17) * (sVar17 < 0x100) * auVar66[10] - (0xff < sVar17);
    sVar17 = auVar66._12_2_;
    cVar8 = (0 < sVar17) * (sVar17 < 0x100) * auVar66[0xc] - (0xff < sVar17);
    auVar91[0xe] = cVar8;
    auVar91._0_14_ = auVar88;
    sVar17 = auVar66._14_2_;
    auVar91[0xf] = (0 < sVar17) * (sVar17 < 0x100) * auVar66[0xe] - (0xff < sVar17);
    auVar76 = auVar76 & auVar31;
    auVar80 = auVar80 & auVar31;
    sVar17 = auVar76._0_2_;
    cVar9 = (0 < sVar17) * (sVar17 < 0x100) * auVar76[0] - (0xff < sVar17);
    sVar17 = auVar76._2_2_;
    sVar68 = CONCAT11((0 < sVar17) * (sVar17 < 0x100) * auVar76[2] - (0xff < sVar17),cVar9);
    sVar17 = auVar76._4_2_;
    cVar10 = (0 < sVar17) * (sVar17 < 0x100) * auVar76[4] - (0xff < sVar17);
    sVar17 = auVar76._6_2_;
    uVar69 = CONCAT13((0 < sVar17) * (sVar17 < 0x100) * auVar76[6] - (0xff < sVar17),
                      CONCAT12(cVar10,sVar68));
    sVar17 = auVar76._8_2_;
    cVar11 = (0 < sVar17) * (sVar17 < 0x100) * auVar76[8] - (0xff < sVar17);
    sVar17 = auVar76._10_2_;
    uVar70 = CONCAT15((0 < sVar17) * (sVar17 < 0x100) * auVar76[10] - (0xff < sVar17),
                      CONCAT14(cVar11,uVar69));
    sVar17 = auVar76._12_2_;
    cVar12 = (0 < sVar17) * (sVar17 < 0x100) * auVar76[0xc] - (0xff < sVar17);
    sVar17 = auVar76._14_2_;
    uVar71 = CONCAT17((0 < sVar17) * (sVar17 < 0x100) * auVar76[0xe] - (0xff < sVar17),
                      CONCAT16(cVar12,uVar70));
    sVar17 = auVar80._0_2_;
    cVar13 = (0 < sVar17) * (sVar17 < 0x100) * auVar80[0] - (0xff < sVar17);
    sVar17 = auVar80._2_2_;
    auVar72._0_10_ =
         CONCAT19((0 < sVar17) * (sVar17 < 0x100) * auVar80[2] - (0xff < sVar17),
                  CONCAT18(cVar13,uVar71));
    sVar17 = auVar80._4_2_;
    cVar14 = (0 < sVar17) * (sVar17 < 0x100) * auVar80[4] - (0xff < sVar17);
    auVar72[10] = cVar14;
    sVar17 = auVar80._6_2_;
    auVar72[0xb] = (0 < sVar17) * (sVar17 < 0x100) * auVar80[6] - (0xff < sVar17);
    sVar17 = auVar80._8_2_;
    cVar15 = (0 < sVar17) * (sVar17 < 0x100) * auVar80[8] - (0xff < sVar17);
    auVar74[0xc] = cVar15;
    auVar74._0_12_ = auVar72;
    sVar17 = auVar80._10_2_;
    auVar74[0xd] = (0 < sVar17) * (sVar17 < 0x100) * auVar80[10] - (0xff < sVar17);
    sVar17 = auVar80._12_2_;
    cVar16 = (0 < sVar17) * (sVar17 < 0x100) * auVar80[0xc] - (0xff < sVar17);
    auVar77[0xe] = cVar16;
    auVar77._0_14_ = auVar74;
    sVar17 = auVar80._14_2_;
    auVar77[0xf] = (0 < sVar17) * (sVar17 < 0x100) * auVar80[0xe] - (0xff < sVar17);
    sVar17 = (short)((uint)uVar83 >> 0x10);
    sVar18 = (short)((uint6)uVar84 >> 0x20);
    sVar19 = (short)((ulong)uVar85 >> 0x30);
    sVar20 = (short)((unkuint10)auVar86._0_10_ >> 0x40);
    sVar21 = auVar86._10_2_;
    sVar22 = auVar88._12_2_;
    sVar23 = auVar91._14_2_;
    sVar24 = (short)((uint)uVar69 >> 0x10);
    sVar25 = (short)((uint6)uVar70 >> 0x20);
    sVar26 = (short)((ulong)uVar71 >> 0x30);
    sVar27 = (short)((unkuint10)auVar72._0_10_ >> 0x40);
    sVar28 = auVar72._10_2_;
    sVar29 = auVar74._12_2_;
    sVar30 = auVar77._14_2_;
    Expand5[lVar32] = (0 < sVar82) * (sVar82 < 0x100) * cVar1 - (0xff < sVar82);
    Expand5[lVar32 + 1] = (0 < sVar17) * (sVar17 < 0x100) * cVar2 - (0xff < sVar17);
    Expand5[lVar32 + 2] = (0 < sVar18) * (sVar18 < 0x100) * cVar3 - (0xff < sVar18);
    Expand5[lVar32 + 3] = (0 < sVar19) * (sVar19 < 0x100) * cVar4 - (0xff < sVar19);
    Expand5[lVar32 + 4] = (0 < sVar20) * (sVar20 < 0x100) * cVar5 - (0xff < sVar20);
    Expand5[lVar32 + 5] = (0 < sVar21) * (sVar21 < 0x100) * cVar6 - (0xff < sVar21);
    Expand5[lVar32 + 6] = (0 < sVar22) * (sVar22 < 0x100) * cVar7 - (0xff < sVar22);
    Expand5[lVar32 + 7] = (0 < sVar23) * (sVar23 < 0x100) * cVar8 - (0xff < sVar23);
    Expand5[lVar32 + 8] = (0 < sVar68) * (sVar68 < 0x100) * cVar9 - (0xff < sVar68);
    Expand5[lVar32 + 9] = (0 < sVar24) * (sVar24 < 0x100) * cVar10 - (0xff < sVar24);
    Expand5[lVar32 + 10] = (0 < sVar25) * (sVar25 < 0x100) * cVar11 - (0xff < sVar25);
    Expand5[lVar32 + 0xb] = (0 < sVar26) * (sVar26 < 0x100) * cVar12 - (0xff < sVar26);
    Expand5[lVar32 + 0xc] = (0 < sVar27) * (sVar27 < 0x100) * cVar13 - (0xff < sVar27);
    Expand5[lVar32 + 0xd] = (0 < sVar28) * (sVar28 < 0x100) * cVar14 - (0xff < sVar28);
    Expand5[lVar32 + 0xe] = (0 < sVar29) * (sVar29 < 0x100) * cVar15 - (0xff < sVar29);
    Expand5[lVar32 + 0xf] = (0 < sVar30) * (sVar30 < 0x100) * cVar16 - (0xff < sVar30);
    lVar32 = lVar32 + 0x10;
    uVar46 = uVar46 + 0x10;
    uVar47 = uVar47 + 0x10;
    uVar48 = uVar48 + 0x10;
    uVar49 = uVar49 + 0x10;
    uVar42 = uVar42 + 0x10;
    uVar43 = uVar43 + 0x10;
    uVar44 = uVar44 + 0x10;
    uVar45 = uVar45 + 0x10;
    uVar38 = uVar38 + 0x10;
    uVar39 = uVar39 + 0x10;
    uVar40 = uVar40 + 0x10;
    uVar41 = uVar41 + 0x10;
    uVar34 = uVar34 + 0x10;
    uVar35 = uVar35 + 0x10;
    uVar36 = uVar36 + 0x10;
    uVar37 = uVar37 + 0x10;
    uVar50 = uVar50 + 0x10;
    uVar51 = uVar51 + 0x10;
    uVar52 = uVar52 + 0x10;
    uVar53 = uVar53 + 0x10;
    uVar54 = uVar54 + 0x10;
    uVar55 = uVar55 + 0x10;
    uVar56 = uVar56 + 0x10;
    uVar57 = uVar57 + 0x10;
    uVar58 = uVar58 + 0x10;
    uVar59 = uVar59 + 0x10;
    uVar60 = uVar60 + 0x10;
    uVar61 = uVar61 + 0x10;
    uVar62 = uVar62 + 0x10;
    uVar63 = uVar63 + 0x10;
    uVar64 = uVar64 + 0x10;
    uVar65 = uVar65 + 0x10;
  } while (lVar32 != 0x20);
  uVar34 = 0xc;
  uVar35 = 0xd;
  uVar36 = 0xe;
  uVar37 = 0xf;
  uVar38 = 8;
  uVar39 = 9;
  uVar40 = 10;
  uVar41 = 0xb;
  uVar42 = 4;
  uVar43 = 5;
  uVar44 = 6;
  uVar45 = 7;
  uVar46 = 0;
  uVar47 = 1;
  uVar48 = 2;
  uVar49 = 3;
  lVar32 = 0;
  uVar62 = uVar34;
  uVar63 = uVar35;
  uVar64 = uVar36;
  uVar65 = uVar37;
  uVar58 = uVar38;
  uVar59 = uVar39;
  uVar60 = uVar40;
  uVar61 = uVar41;
  uVar54 = uVar42;
  uVar55 = uVar43;
  uVar56 = uVar44;
  uVar57 = uVar45;
  uVar50 = uVar46;
  uVar51 = uVar47;
  uVar52 = uVar48;
  uVar53 = uVar49;
  do {
    auVar92._0_4_ = uVar50 * 4 + (uVar46 >> 4);
    auVar92._4_4_ = uVar51 * 4 + (uVar47 >> 4);
    auVar92._8_4_ = uVar52 * 4 + (uVar48 >> 4);
    auVar92._12_4_ = uVar53 * 4 + (uVar49 >> 4);
    auVar67._0_4_ = uVar54 * 4 + (uVar42 >> 4);
    auVar67._4_4_ = uVar55 * 4 + (uVar43 >> 4);
    auVar67._8_4_ = uVar56 * 4 + (uVar44 >> 4);
    auVar67._12_4_ = uVar57 * 4 + (uVar45 >> 4);
    auVar78._0_4_ = uVar58 * 4 + (uVar38 >> 4);
    auVar78._4_4_ = uVar59 * 4 + (uVar39 >> 4);
    auVar78._8_4_ = uVar60 * 4 + (uVar40 >> 4);
    auVar78._12_4_ = uVar61 * 4 + (uVar41 >> 4);
    auVar81._0_4_ = uVar62 * 4 + (uVar34 >> 4);
    auVar81._4_4_ = uVar63 * 4 + (uVar35 >> 4);
    auVar81._8_4_ = uVar64 * 4 + (uVar36 >> 4);
    auVar81._12_4_ = uVar65 * 4 + (uVar37 >> 4);
    auVar92 = auVar92 & auVar31;
    auVar67 = auVar67 & auVar31;
    sVar17 = auVar92._0_2_;
    cVar2 = (0 < sVar17) * (sVar17 < 0x100) * auVar92[0] - (0xff < sVar17);
    sVar17 = auVar92._2_2_;
    sVar82 = CONCAT11((0 < sVar17) * (sVar17 < 0x100) * auVar92[2] - (0xff < sVar17),cVar2);
    sVar17 = auVar92._4_2_;
    cVar1 = (0 < sVar17) * (sVar17 < 0x100) * auVar92[4] - (0xff < sVar17);
    sVar17 = auVar92._6_2_;
    uVar83 = CONCAT13((0 < sVar17) * (sVar17 < 0x100) * auVar92[6] - (0xff < sVar17),
                      CONCAT12(cVar1,sVar82));
    sVar17 = auVar92._8_2_;
    cVar8 = (0 < sVar17) * (sVar17 < 0x100) * auVar92[8] - (0xff < sVar17);
    sVar17 = auVar92._10_2_;
    uVar84 = CONCAT15((0 < sVar17) * (sVar17 < 0x100) * auVar92[10] - (0xff < sVar17),
                      CONCAT14(cVar8,uVar83));
    sVar17 = auVar92._12_2_;
    cVar7 = (0 < sVar17) * (sVar17 < 0x100) * auVar92[0xc] - (0xff < sVar17);
    sVar17 = auVar92._14_2_;
    uVar85 = CONCAT17((0 < sVar17) * (sVar17 < 0x100) * auVar92[0xe] - (0xff < sVar17),
                      CONCAT16(cVar7,uVar84));
    sVar17 = auVar67._0_2_;
    cVar6 = (0 < sVar17) * (sVar17 < 0x100) * auVar67[0] - (0xff < sVar17);
    sVar17 = auVar67._2_2_;
    auVar87._0_10_ =
         CONCAT19((0 < sVar17) * (sVar17 < 0x100) * auVar67[2] - (0xff < sVar17),
                  CONCAT18(cVar6,uVar85));
    sVar17 = auVar67._4_2_;
    cVar5 = (0 < sVar17) * (sVar17 < 0x100) * auVar67[4] - (0xff < sVar17);
    auVar87[10] = cVar5;
    sVar17 = auVar67._6_2_;
    auVar87[0xb] = (0 < sVar17) * (sVar17 < 0x100) * auVar67[6] - (0xff < sVar17);
    sVar17 = auVar67._8_2_;
    cVar4 = (0 < sVar17) * (sVar17 < 0x100) * auVar67[8] - (0xff < sVar17);
    auVar89[0xc] = cVar4;
    auVar89._0_12_ = auVar87;
    sVar17 = auVar67._10_2_;
    auVar89[0xd] = (0 < sVar17) * (sVar17 < 0x100) * auVar67[10] - (0xff < sVar17);
    sVar17 = auVar67._12_2_;
    cVar3 = (0 < sVar17) * (sVar17 < 0x100) * auVar67[0xc] - (0xff < sVar17);
    auVar93[0xe] = cVar3;
    auVar93._0_14_ = auVar89;
    sVar17 = auVar67._14_2_;
    auVar93[0xf] = (0 < sVar17) * (sVar17 < 0x100) * auVar67[0xe] - (0xff < sVar17);
    auVar78 = auVar78 & auVar31;
    auVar81 = auVar81 & auVar31;
    sVar17 = auVar78._0_2_;
    cVar11 = (0 < sVar17) * (sVar17 < 0x100) * auVar78[0] - (0xff < sVar17);
    sVar17 = auVar78._2_2_;
    sVar68 = CONCAT11((0 < sVar17) * (sVar17 < 0x100) * auVar78[2] - (0xff < sVar17),cVar11);
    sVar17 = auVar78._4_2_;
    cVar16 = (0 < sVar17) * (sVar17 < 0x100) * auVar78[4] - (0xff < sVar17);
    sVar17 = auVar78._6_2_;
    uVar69 = CONCAT13((0 < sVar17) * (sVar17 < 0x100) * auVar78[6] - (0xff < sVar17),
                      CONCAT12(cVar16,sVar68));
    sVar17 = auVar78._8_2_;
    cVar15 = (0 < sVar17) * (sVar17 < 0x100) * auVar78[8] - (0xff < sVar17);
    sVar17 = auVar78._10_2_;
    uVar70 = CONCAT15((0 < sVar17) * (sVar17 < 0x100) * auVar78[10] - (0xff < sVar17),
                      CONCAT14(cVar15,uVar69));
    sVar17 = auVar78._12_2_;
    cVar14 = (0 < sVar17) * (sVar17 < 0x100) * auVar78[0xc] - (0xff < sVar17);
    sVar17 = auVar78._14_2_;
    uVar71 = CONCAT17((0 < sVar17) * (sVar17 < 0x100) * auVar78[0xe] - (0xff < sVar17),
                      CONCAT16(cVar14,uVar70));
    sVar17 = auVar81._0_2_;
    cVar13 = (0 < sVar17) * (sVar17 < 0x100) * auVar81[0] - (0xff < sVar17);
    sVar17 = auVar81._2_2_;
    auVar73._0_10_ =
         CONCAT19((0 < sVar17) * (sVar17 < 0x100) * auVar81[2] - (0xff < sVar17),
                  CONCAT18(cVar13,uVar71));
    sVar17 = auVar81._4_2_;
    cVar12 = (0 < sVar17) * (sVar17 < 0x100) * auVar81[4] - (0xff < sVar17);
    auVar73[10] = cVar12;
    sVar17 = auVar81._6_2_;
    auVar73[0xb] = (0 < sVar17) * (sVar17 < 0x100) * auVar81[6] - (0xff < sVar17);
    sVar17 = auVar81._8_2_;
    cVar10 = (0 < sVar17) * (sVar17 < 0x100) * auVar81[8] - (0xff < sVar17);
    auVar75[0xc] = cVar10;
    auVar75._0_12_ = auVar73;
    sVar17 = auVar81._10_2_;
    auVar75[0xd] = (0 < sVar17) * (sVar17 < 0x100) * auVar81[10] - (0xff < sVar17);
    sVar17 = auVar81._12_2_;
    cVar9 = (0 < sVar17) * (sVar17 < 0x100) * auVar81[0xc] - (0xff < sVar17);
    auVar79[0xe] = cVar9;
    auVar79._0_14_ = auVar75;
    sVar17 = auVar81._14_2_;
    auVar79[0xf] = (0 < sVar17) * (sVar17 < 0x100) * auVar81[0xe] - (0xff < sVar17);
    sVar17 = (short)((uint)uVar83 >> 0x10);
    sVar18 = (short)((uint6)uVar84 >> 0x20);
    sVar19 = (short)((ulong)uVar85 >> 0x30);
    sVar20 = (short)((unkuint10)auVar87._0_10_ >> 0x40);
    sVar21 = auVar87._10_2_;
    sVar22 = auVar89._12_2_;
    sVar23 = auVar93._14_2_;
    sVar24 = (short)((uint)uVar69 >> 0x10);
    sVar25 = (short)((uint6)uVar70 >> 0x20);
    sVar26 = (short)((ulong)uVar71 >> 0x30);
    sVar27 = (short)((unkuint10)auVar73._0_10_ >> 0x40);
    sVar28 = auVar73._10_2_;
    sVar29 = auVar75._12_2_;
    sVar30 = auVar79._14_2_;
    Expand6[lVar32] = (0 < sVar82) * (sVar82 < 0x100) * cVar2 - (0xff < sVar82);
    Expand6[lVar32 + 1] = (0 < sVar17) * (sVar17 < 0x100) * cVar1 - (0xff < sVar17);
    Expand6[lVar32 + 2] = (0 < sVar18) * (sVar18 < 0x100) * cVar8 - (0xff < sVar18);
    Expand6[lVar32 + 3] = (0 < sVar19) * (sVar19 < 0x100) * cVar7 - (0xff < sVar19);
    Expand6[lVar32 + 4] = (0 < sVar20) * (sVar20 < 0x100) * cVar6 - (0xff < sVar20);
    Expand6[lVar32 + 5] = (0 < sVar21) * (sVar21 < 0x100) * cVar5 - (0xff < sVar21);
    Expand6[lVar32 + 6] = (0 < sVar22) * (sVar22 < 0x100) * cVar4 - (0xff < sVar22);
    Expand6[lVar32 + 7] = (0 < sVar23) * (sVar23 < 0x100) * cVar3 - (0xff < sVar23);
    Expand6[lVar32 + 8] = (0 < sVar68) * (sVar68 < 0x100) * cVar11 - (0xff < sVar68);
    Expand6[lVar32 + 9] = (0 < sVar24) * (sVar24 < 0x100) * cVar16 - (0xff < sVar24);
    Expand6[lVar32 + 10] = (0 < sVar25) * (sVar25 < 0x100) * cVar15 - (0xff < sVar25);
    Expand6[lVar32 + 0xb] = (0 < sVar26) * (sVar26 < 0x100) * cVar14 - (0xff < sVar26);
    Expand6[lVar32 + 0xc] = (0 < sVar27) * (sVar27 < 0x100) * cVar13 - (0xff < sVar27);
    Expand6[lVar32 + 0xd] = (0 < sVar28) * (sVar28 < 0x100) * cVar12 - (0xff < sVar28);
    Expand6[lVar32 + 0xe] = (0 < sVar29) * (sVar29 < 0x100) * cVar10 - (0xff < sVar29);
    Expand6[lVar32 + 0xf] = (0 < sVar30) * (sVar30 < 0x100) * cVar9 - (0xff < sVar30);
    lVar32 = lVar32 + 0x10;
    uVar46 = uVar46 + 0x10;
    uVar47 = uVar47 + 0x10;
    uVar48 = uVar48 + 0x10;
    uVar49 = uVar49 + 0x10;
    uVar42 = uVar42 + 0x10;
    uVar43 = uVar43 + 0x10;
    uVar44 = uVar44 + 0x10;
    uVar45 = uVar45 + 0x10;
    uVar38 = uVar38 + 0x10;
    uVar39 = uVar39 + 0x10;
    uVar40 = uVar40 + 0x10;
    uVar41 = uVar41 + 0x10;
    uVar34 = uVar34 + 0x10;
    uVar35 = uVar35 + 0x10;
    uVar36 = uVar36 + 0x10;
    uVar37 = uVar37 + 0x10;
    uVar50 = uVar50 + 0x10;
    uVar51 = uVar51 + 0x10;
    uVar52 = uVar52 + 0x10;
    uVar53 = uVar53 + 0x10;
    uVar54 = uVar54 + 0x10;
    uVar55 = uVar55 + 0x10;
    uVar56 = uVar56 + 0x10;
    uVar57 = uVar57 + 0x10;
    uVar58 = uVar58 + 0x10;
    uVar59 = uVar59 + 0x10;
    uVar60 = uVar60 + 0x10;
    uVar61 = uVar61 + 0x10;
    uVar62 = uVar62 + 0x10;
    uVar63 = uVar63 + 0x10;
    uVar64 = uVar64 + 0x10;
    uVar65 = uVar65 + 0x10;
  } while (lVar32 != 0x40);
  lVar32 = 0;
  do {
    iVar33 = 8;
    if (8 < (int)lVar32) {
      iVar33 = (int)lVar32;
    }
    if (0x106 < iVar33) {
      iVar33 = 0x107;
    }
    (&QuantRBTab)[lVar32] = Expand5[(iVar33 * 0x1f + (iVar33 * 0x1f - 0x78U >> 8)) - 0x78 >> 8];
    (&QuantGTab)[lVar32] = Expand6[((iVar33 * 0x3f - 0x178U >> 8) + iVar33 * 0x3f) - 0x178 >> 8];
    lVar32 = lVar32 + 1;
  } while (lVar32 != 0x110);
  PrepareOptTable4(OMatch5,Expand5,0x20);
  PrepareOptTable4(OMatch6,Expand6,0x40);
  PrepareOptTable3(OMatch5_3,Expand5,0x20);
  PrepareOptTable3(OMatch6_3,Expand6,0x40);
  return;
}

Assistant:

void sInitDXT() {
  for (sInt i = 0; i < 32; i++)
    Expand5[i] = (i << 3) | (i >> 2);

  for (sInt i = 0; i < 64; i++)
    Expand6[i] = (i << 2) | (i >> 4);

  for (sInt i = 0; i < 256 + 16; i++) {
    sInt v = sClamp(i - 8, 0, 255);
    QuantRBTab[i] = Expand5[Mul8Bit(v, 31)];
    QuantGTab[i] = Expand6[Mul8Bit(v, 63)];
  }

  PrepareOptTable4(&OMatch5[0][0], Expand5, 32);
  PrepareOptTable4(&OMatch6[0][0], Expand6, 64);

  PrepareOptTable3(&OMatch5_3[0][0], Expand5, 32);
  PrepareOptTable3(&OMatch6_3[0][0], Expand6, 64);
}